

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

void __thiscall
rr::TriangleRasterizer::rasterizeMultiSample<2>
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  int *piVar1;
  FragmentPacket *pFVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  byte bVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  Vector<long,_4> *pVVar23;
  Vector<long,_4> *pVVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  int fragNdx;
  long lVar34;
  long lVar35;
  Vector<long,_4> *pVVar36;
  long lVar37;
  float fVar38;
  float fVar39;
  Vec4 z0;
  Vec4 z1;
  Vec4 e20f;
  Vec4 e12f;
  Vec4 e01f;
  undefined8 local_178;
  undefined8 uStack_170;
  deInt64 sy [4];
  Vec4 edgeSum;
  long local_138 [2];
  int local_128;
  int iStack_124;
  long lStack_120;
  Vector<long,_4> e20 [2];
  Vector<long,_4> e12 [2];
  Vector<long,_4> e01 [2];
  tcu local_50 [16];
  Vec4 bSum;
  
  fVar3 = (this->m_v2).m_data[2];
  fVar38 = (this->m_v0).m_data[2] - fVar3;
  fVar39 = (this->m_v1).m_data[2] - fVar3;
  iVar14 = 0;
  while( true ) {
    iVar4 = (this->m_curPos).m_data[1];
    if (((this->m_bboxMax).m_data[1] < iVar4) || (maxFragmentPackets <= iVar14)) break;
    iVar5 = (this->m_curPos).m_data[0];
    sy[0] = (deInt64)(iVar4 << 8);
    iVar17 = iVar4 + 1;
    sy[2] = (deInt64)(iVar17 * 0x100);
    iVar27 = iVar5 + 1;
    e20[0].m_data[0]._0_4_ = iVar27 * 0x100;
    e20[0].m_data[0]._4_4_ = -(uint)((int)e20[0].m_data[0] < 0);
    local_138[0] = CONCAT44(-(uint)(iVar5 << 8 < 0),iVar5 << 8);
    _local_128 = CONCAT44(e20[0].m_data[0]._4_4_,(int)e20[0].m_data[0]);
    iVar12 = (this->m_viewport).m_data[2] + (this->m_viewport).m_data[0];
    iVar13 = (this->m_viewport).m_data[3] + (this->m_viewport).m_data[1];
    lVar22 = 0;
    sy[1] = sy[0];
    sy[3] = sy[2];
    do {
      tcu::Vector<long,_4>::Vector((Vector<long,_4> *)((long)e01[0].m_data + lVar22));
      lVar22 = lVar22 + 0x20;
    } while (lVar22 != 0x40);
    lVar22 = 0;
    do {
      tcu::Vector<long,_4>::Vector((Vector<long,_4> *)((long)e12[0].m_data + lVar22));
      lVar22 = lVar22 + 0x20;
    } while (lVar22 != 0x40);
    lVar22 = 0;
    do {
      tcu::Vector<long,_4>::Vector((Vector<long,_4> *)((long)e20[0].m_data + lVar22));
      lVar22 = lVar22 + 0x20;
    } while (lVar22 != 0x40);
    lVar22 = (this->m_edge01).a;
    lVar21 = (this->m_edge01).b;
    lVar29 = (this->m_edge01).c;
    lVar31 = (this->m_edge12).a;
    lVar6 = (this->m_edge12).b;
    lVar7 = (this->m_edge12).c;
    lVar8 = (this->m_edge20).a;
    lVar9 = (this->m_edge20).b;
    lVar10 = (this->m_edge20).c;
    pVVar36 = e01;
    pVVar24 = e12;
    pVVar23 = e20;
    for (lVar35 = 0; lVar35 != 2; lVar35 = lVar35 + 1) {
      lVar33 = (&s_samplePos2)[lVar35 * 2];
      lVar37 = (&DAT_00986198)[lVar35 * 2];
      for (lVar34 = 0; lVar34 != 4; lVar34 = lVar34 + 1) {
        lVar15 = local_138[lVar34] + lVar33;
        lVar19 = sy[lVar34] + lVar37;
        pVVar36->m_data[lVar34] = lVar21 * lVar19 + lVar22 * lVar15 + lVar29;
        pVVar24->m_data[lVar34] = lVar6 * lVar19 + lVar31 * lVar15 + lVar7;
        pVVar23->m_data[lVar34] = lVar19 * lVar9 + lVar15 * lVar8 + lVar10;
      }
      pVVar23 = pVVar23 + 1;
      pVVar24 = pVVar24 + 1;
      pVVar36 = pVVar36 + 1;
    }
    uVar20 = (ulong)(this->m_edge01).inclusive;
    lVar21 = -uVar20;
    uVar28 = (ulong)(this->m_edge12).inclusive;
    lVar29 = -uVar28;
    uVar30 = (ulong)(this->m_edge20).inclusive;
    lVar31 = -uVar30;
    lVar22 = 0x18;
    uVar25 = 0;
    for (uVar18 = 0; uVar18 != 2; uVar18 = uVar18 + 1) {
      lVar6 = *(long *)((long)e12[1].m_data + lVar22 + 8);
      if ((lVar6 == lVar21 || SBORROW8(lVar6,lVar21) != (long)(lVar6 + uVar20) < 0) ||
         (lVar6 = *(long *)((long)e20[1].m_data + lVar22 + 8),
         lVar6 == lVar29 || SBORROW8(lVar6,lVar29) != (long)(lVar6 + uVar28) < 0)) {
        bVar11 = false;
      }
      else {
        lVar6 = *(long *)((long)local_138 + lVar22 + 8);
        bVar11 = lVar6 != lVar31 && SBORROW8(lVar6,lVar31) == (long)(lVar6 + uVar30) < 0;
      }
      uVar26 = uVar25 & ~(1L << (uVar18 & 0x3f));
      if (bVar11) {
        uVar26 = uVar25 | 1L << (uVar18 & 0x3f);
      }
      if (((iVar27 == iVar12) ||
          (lVar6 = *(long *)((long)e12[1].m_data + lVar22 + 0x10),
          lVar6 == lVar21 || SBORROW8(lVar6,lVar21) != (long)(lVar6 + uVar20) < 0)) ||
         (lVar6 = *(long *)((long)e20[1].m_data + lVar22 + 0x10),
         lVar6 == lVar29 || SBORROW8(lVar6,lVar29) != (long)(lVar6 + uVar28) < 0)) {
        bVar11 = false;
      }
      else {
        lVar6 = *(long *)((long)&local_128 + lVar22);
        bVar11 = lVar6 != lVar31 && SBORROW8(lVar6,lVar31) == (long)(lVar6 + uVar30) < 0;
      }
      bVar16 = (byte)uVar18;
      uVar32 = 0x10L << (bVar16 & 0x3f);
      uVar25 = ~uVar32 & uVar26;
      if (bVar11) {
        uVar25 = uVar26 | uVar32;
      }
      if (((iVar17 == iVar13) ||
          (lVar6 = *(long *)((long)e12[1].m_data + lVar22 + 0x18),
          lVar6 == lVar21 || SBORROW8(lVar6,lVar21) != (long)(lVar6 + uVar20) < 0)) ||
         (lVar6 = *(long *)((long)e20[1].m_data + lVar22 + 0x18),
         lVar6 == lVar29 || SBORROW8(lVar6,lVar29) != (long)(lVar6 + uVar28) < 0)) {
        bVar11 = false;
      }
      else {
        lVar6 = *(long *)((long)&lStack_120 + lVar22);
        bVar11 = lVar6 != lVar31 && SBORROW8(lVar6,lVar31) == (long)(lVar6 + uVar30) < 0;
      }
      uVar32 = 4L << (bVar16 & 0x3f);
      uVar26 = ~uVar32 & uVar25;
      if (bVar11) {
        uVar26 = uVar25 | uVar32;
      }
      if (((iVar17 == iVar13 || iVar27 == iVar12) ||
          (lVar6 = *(long *)((long)e01[0].m_data + lVar22),
          lVar6 == lVar21 || SBORROW8(lVar6,lVar21) != (long)(lVar6 + uVar20) < 0)) ||
         (lVar6 = *(long *)((long)e12[0].m_data + lVar22),
         lVar6 == lVar29 || SBORROW8(lVar6,lVar29) != (long)(lVar6 + uVar28) < 0)) {
        bVar11 = false;
      }
      else {
        lVar6 = *(long *)((long)e20[0].m_data + lVar22);
        bVar11 = lVar6 != lVar31 && SBORROW8(lVar6,lVar31) == (long)(lVar6 + uVar30) < 0;
      }
      uVar32 = 0x40L << (bVar16 & 0x3f);
      uVar25 = ~uVar32 & uVar26;
      if (bVar11) {
        uVar25 = uVar26 | uVar32;
      }
      lVar22 = lVar22 + 0x20;
    }
    iVar12 = (this->m_curPos).m_data[0] + 2;
    (this->m_curPos).m_data[0] = iVar12;
    if ((this->m_bboxMax).m_data[0] < iVar12) {
      piVar1 = (this->m_curPos).m_data + 1;
      *piVar1 = *piVar1 + 2;
      (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
    }
    if (uVar25 != 0) {
      if (depthValues != (float *)0x0) {
        lVar22 = (long)(iVar14 * 8) * 4;
        for (lVar21 = -8; lVar21 != 0; lVar21 = lVar21 + 4) {
          tcu::Vector<long,_4>::cast<float>((Vector<long,_4> *)&e01f);
          tcu::Vector<long,_4>::cast<float>((Vector<long,_4> *)&e12f);
          tcu::Vector<long,_4>::cast<float>((Vector<long,_4> *)&e20f);
          tcu::operator+((tcu *)&z0,&e01f,(Vector<float,_4> *)&e12f);
          tcu::operator+((tcu *)&edgeSum,(Vector<float,_4> *)&z0,&e20f);
          tcu::operator/((tcu *)&z0,&e12f,(Vector<float,_4> *)&edgeSum);
          tcu::operator/((tcu *)&z1,&e20f,(Vector<float,_4> *)&edgeSum);
          *(float *)((long)depthValues + lVar21 + lVar22 + 8) =
               z0.m_data[0] * fVar38 + z1.m_data[0] * fVar39 + fVar3;
          *(float *)((long)depthValues + lVar21 + lVar22 + 0x10) =
               z0.m_data[1] * fVar38 + z1.m_data[1] * fVar39 + fVar3;
          *(float *)((long)depthValues + lVar21 + lVar22 + 0x18) =
               z0.m_data[2] * fVar38 + z1.m_data[2] * fVar39 + fVar3;
          *(float *)((long)depthValues + lVar21 + lVar22 + 0x20) =
               z0.m_data[3] * fVar38 + z1.m_data[3] * fVar39 + fVar3;
        }
      }
      tcu::Vector<float,_4>::Vector(&e01f);
      tcu::Vector<float,_4>::Vector(&e12f);
      tcu::Vector<float,_4>::Vector(&e20f);
      lVar22 = (this->m_edge01).a;
      lVar21 = (this->m_edge01).b;
      lVar29 = (this->m_edge01).c;
      lVar31 = (this->m_edge12).a;
      lVar6 = (this->m_edge12).b;
      lVar7 = (this->m_edge12).c;
      lVar8 = (this->m_edge20).a;
      lVar9 = (this->m_edge20).b;
      lVar10 = (this->m_edge20).c;
      for (lVar35 = 0; lVar35 != 0x10; lVar35 = lVar35 + 4) {
        lVar37 = *(long *)((long)local_138 + lVar35 * 2) + 0x80;
        lVar33 = *(long *)((long)sy + lVar35 * 2) + 0x80;
        *(float *)((long)e01f.m_data + lVar35) = (float)(lVar21 * lVar33 + lVar22 * lVar37 + lVar29)
        ;
        *(float *)((long)e12f.m_data + lVar35) = (float)(lVar6 * lVar33 + lVar31 * lVar37 + lVar7);
        *(float *)((long)e20f.m_data + lVar35) = (float)(lVar33 * lVar9 + lVar37 * lVar8 + lVar10);
      }
      tcu::operator*((tcu *)&edgeSum,(this->m_v0).m_data[3],&e12f);
      tcu::operator*((tcu *)&z0,(this->m_v1).m_data[3],&e20f);
      tcu::operator*((tcu *)&z1,(this->m_v2).m_data[3],&e01f);
      tcu::operator+((tcu *)&local_178,(Vector<float,_4> *)&edgeSum,(Vector<float,_4> *)&z0);
      tcu::operator+((tcu *)&bSum,(Vector<float,_4> *)&local_178,(Vector<float,_4> *)&z1);
      pFVar2 = fragmentPackets + iVar14;
      *(ulong *)(pFVar2->position).m_data = CONCAT44(iVar4,iVar5);
      pFVar2->coverage = uVar25;
      tcu::operator/((tcu *)&local_178,&edgeSum,(Vector<float,_4> *)&bSum);
      *(undefined8 *)pFVar2->barycentric[0].m_data = local_178;
      *(undefined8 *)(pFVar2->barycentric[0].m_data + 2) = uStack_170;
      tcu::operator/((tcu *)&local_178,&z0,(Vector<float,_4> *)&bSum);
      *(undefined8 *)fragmentPackets[iVar14].barycentric[1].m_data = local_178;
      *(undefined8 *)(fragmentPackets[iVar14].barycentric[1].m_data + 2) = uStack_170;
      tcu::operator-(local_50,1.0,pFVar2->barycentric);
      tcu::operator-((tcu *)&local_178,(Vector<float,_4> *)local_50,
                     fragmentPackets[iVar14].barycentric + 1);
      *(undefined8 *)fragmentPackets[iVar14].barycentric[2].m_data = local_178;
      *(undefined8 *)(fragmentPackets[iVar14].barycentric[2].m_data + 2) = uStack_170;
      iVar14 = iVar14 + 1;
    }
  }
  *numPacketsRasterized = iVar14;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeMultiSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64*	samplePos	= DE_NULL;
	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation, see rasterizeSingleSample
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	switch (NumSamples)
	{
		case 2:		samplePos = s_samplePos2;	break;
		case 4:		samplePos = s_samplePos4;	break;
		case 8:		samplePos = s_samplePos8;	break;
		case 16:	samplePos = s_samplePos16;	break;
		default:
			DE_ASSERT(false);
	}

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Base subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0);
		const deInt64	sx1		= toSubpixelCoord(x0+1);
		const deInt64	sy0		= toSubpixelCoord(y0);
		const deInt64	sy1		= toSubpixelCoord(y0+1);

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01[NumSamples];
		tcu::Vector<deInt64, 4>	e12[NumSamples];
		tcu::Vector<deInt64, 4>	e20[NumSamples];

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values at sample positions
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			const deInt64 ox = samplePos[sampleNdx*2 + 0];
			const deInt64 oy = samplePos[sampleNdx*2 + 1];

			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				e01[sampleNdx][fragNdx] = evaluateEdge(m_edge01, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e12[sampleNdx][fragNdx] = evaluateEdge(m_edge12, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e20[sampleNdx][fragNdx] = evaluateEdge(m_edge20, sx[fragNdx] + ox, sy[fragNdx] + oy);
			}
		}

		// Compute coverage mask
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			coverage = setCoverageValue(coverage, NumSamples, 0, 0, sampleNdx,						isInsideCCW(m_edge01, e01[sampleNdx][0]) && isInsideCCW(m_edge12, e12[sampleNdx][0]) && isInsideCCW(m_edge20, e20[sampleNdx][0]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 0, sampleNdx, !outX1 &&			isInsideCCW(m_edge01, e01[sampleNdx][1]) && isInsideCCW(m_edge12, e12[sampleNdx][1]) && isInsideCCW(m_edge20, e20[sampleNdx][1]));
			coverage = setCoverageValue(coverage, NumSamples, 0, 1, sampleNdx, !outY1 &&			isInsideCCW(m_edge01, e01[sampleNdx][2]) && isInsideCCW(m_edge12, e12[sampleNdx][2]) && isInsideCCW(m_edge20, e20[sampleNdx][2]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 1, sampleNdx, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[sampleNdx][3]) && isInsideCCW(m_edge12, e12[sampleNdx][3]) && isInsideCCW(m_edge20, e20[sampleNdx][3]));
		}

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Compute depth values.
		if (depthValues)
		{
			for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
			{
				// Floating-point edge values at sample coordinates.
				const tcu::Vec4&	e01f	= e01[sampleNdx].asFloat();
				const tcu::Vec4&	e12f	= e12[sampleNdx].asFloat();
				const tcu::Vec4&	e20f	= e20[sampleNdx].asFloat();

				const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
				const tcu::Vec4		z0		= e12f / edgeSum;
				const tcu::Vec4		z1		= e20f / edgeSum;

				depthValues[(packetNdx*4+0)*NumSamples + sampleNdx] = z0[0]*za + z1[0]*zb + zc;
				depthValues[(packetNdx*4+1)*NumSamples + sampleNdx] = z0[1]*za + z1[1]*zb + zc;
				depthValues[(packetNdx*4+2)*NumSamples + sampleNdx] = z0[2]*za + z1[2]*zb + zc;
				depthValues[(packetNdx*4+3)*NumSamples + sampleNdx] = z0[3]*za + z1[3]*zb + zc;
			}
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			// Floating-point edge values at pixel center.
			tcu::Vec4			e01f;
			tcu::Vec4			e12f;
			tcu::Vec4			e20f;

			for (int i = 0; i < 4; i++)
			{
				e01f[i] = float(evaluateEdge(m_edge01, sx[i] + halfPixel, sy[i] + halfPixel));
				e12f[i] = float(evaluateEdge(m_edge12, sx[i] + halfPixel, sy[i] + halfPixel));
				e20f[i] = float(evaluateEdge(m_edge20, sx[i] + halfPixel, sy[i] + halfPixel));
			}

			// Barycentrics & scale.
			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}